

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

double __thiscall ON_PolyEdgeCurve::EdgeParameter(ON_PolyEdgeCurve *this,double t)

{
  bool bVar1;
  int segment_index;
  ON_PolyEdgeSegment *this_00;
  double dVar2;
  ON_Interval sdom;
  ON_Interval pdom;
  ON_Interval local_38;
  ON_Interval local_28;
  
  segment_index = ON_PolyCurve::SegmentIndex(&this->super_ON_PolyCurve,t);
  this_00 = SegmentCurve(this,segment_index);
  if (this_00 == (ON_PolyEdgeSegment *)0x0) {
    dVar2 = -1.23432101234321e+308;
  }
  else {
    local_28 = ON_PolyCurve::SegmentDomain(&this->super_ON_PolyCurve,segment_index);
    dVar2 = local_28.m_t[1];
    (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])(this_00);
    local_38.m_t[1] = dVar2;
    bVar1 = ON_Interval::operator!=(&local_38,&local_28);
    if (bVar1) {
      dVar2 = ON_Interval::NormalizedParameterAt(&local_28,t);
      t = ON_Interval::ParameterAt(&local_38,dVar2);
    }
    dVar2 = ON_PolyEdgeSegment::EdgeParameter(this_00,t);
  }
  return dVar2;
}

Assistant:

double ON_PolyEdgeCurve::EdgeParameter(double t) const
{
  double edge_t = ON_UNSET_VALUE;
  int segment_index = SegmentIndex(t);
  ON_PolyEdgeSegment* seg = SegmentCurve( segment_index );
  if ( seg )
  {
    ON_Interval pdom = SegmentDomain(segment_index);
    ON_Interval sdom = seg->Domain();
    if ( sdom != pdom )
    {
      double s = pdom.NormalizedParameterAt(t);
      t = sdom.ParameterAt(s);
    }
    edge_t = seg->EdgeParameter(t);
  }
  return edge_t;
}